

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  if (((anonymous_namespace)::chartype_table[(byte)*s] & 8) == 0) {
    lVar7 = 0;
    pbVar5 = (byte *)0x0;
  }
  else {
    lVar7 = 0;
    do {
      lVar6 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (((anonymous_namespace)::chartype_table[(byte)s[lVar6]] & 8) != 0);
    s = s + lVar7;
    pbVar5 = (byte *)s;
  }
  do {
    pbVar4 = pbVar5;
    lVar6 = lVar7;
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 0xc) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 0xc) != 0) {
        s = (char_t *)((byte *)s + 1);
        goto LAB_00331782;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 0xc) != 0) {
        s = (char_t *)((byte *)s + 2);
        goto LAB_00331782;
      }
      bVar8 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 0xc) == 0;
      if (bVar8) {
        s = (char_t *)((byte *)s + 4);
      }
      else {
        s = (char_t *)((byte *)s + 3);
      }
    }
    else {
LAB_00331782:
      bVar8 = false;
    }
    lVar7 = lVar6;
    pbVar5 = pbVar4;
    if (!bVar8) {
      bVar3 = *s;
      if (bVar3 == end_quote) {
        pbVar5 = (byte *)s;
        if (pbVar4 != (byte *)0x0) {
          memmove(pbVar4 + -lVar6,pbVar4,(long)s - (long)pbVar4);
          pbVar5 = (byte *)s + -lVar6;
        }
        do {
          *pbVar5 = 0;
          pbVar4 = pbVar5 + -1;
          pbVar5 = pbVar5 + -1;
        } while (((anonymous_namespace)::chartype_table[*pbVar4] & 8) != 0);
        return (char_t *)((byte *)s + 1);
      }
      if (((anonymous_namespace)::chartype_table[bVar3] & 8) == 0) {
        if ((ulong)bVar3 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)((byte *)s + 1);
      }
      else {
        pbVar1 = (byte *)s + 1;
        *s = 0x20;
        pbVar2 = (byte *)s + 1;
        s = (char_t *)pbVar1;
        if (((anonymous_namespace)::chartype_table[*pbVar2] & 8) != 0) {
          do {
            pbVar5 = (byte *)s + 1;
            s = (char_t *)((byte *)s + 1);
            lVar7 = lVar7 + 1;
          } while (((anonymous_namespace)::chartype_table[*pbVar5] & 8) != 0);
          pbVar5 = (byte *)s;
          if (pbVar4 != (byte *)0x0) {
            memmove(pbVar4 + -lVar6,pbVar4,(long)pbVar1 - (long)pbVar4);
          }
        }
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}